

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O1

void __thiscall Automaton::buildIncludesDigraph(Automaton *this)

{
  Name *this_00;
  _Base_ptr *__k;
  Grammar *pGVar1;
  QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
  *pQVar2;
  _Base_ptr p_Var3;
  _List_node_base *p_Var4;
  const_iterator cVar5;
  const_iterator cVar6;
  iterator iVar7;
  iterator other;
  iterator iVar8;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  _Var9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr *pp_Var11;
  _List_node_base *extraout_RDX;
  _List_node_base *extraout_RDX_00;
  _List_node_base *extraout_RDX_01;
  Name NVar12;
  Name extraout_RDX_02;
  undefined8 *puVar13;
  _Base_ptr p_Var14;
  Node<Include> *this_01;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
  pVar15;
  Include data;
  Include data_00;
  Name name;
  Node<Include> *local_78;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  local_50;
  key_type local_48;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (Node<Include> *)
            (this->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (this_01 != (Node<Include> *)&this->states) {
    do {
      this_00 = &this_01[1].data.nt;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var10 = (_Rb_tree_node_base *)this_01[1].data.nt._M_node[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      if (p_Var10 != (_Rb_tree_node_base *)(this_01[1].data.nt._M_node + 1)) {
        do {
          local_48._M_node = *(_List_node_base **)(p_Var10 + 1);
          pGVar1 = this->_M_grammar;
          local_40._M_node = local_48._M_node;
          cVar5 = std::
                  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  ::find(&(pGVar1->non_terminals)._M_t,&local_40);
          if ((_Rb_tree_header *)cVar5._M_node !=
              &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
            pQVar2 = (this->_M_grammar->rule_map).d.d.ptr;
            if (pQVar2 == (QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
                           *)0x0) {
              pVar15 = (pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
                        )ZEXT816(0);
            }
            else {
              pVar15 = std::
                       _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
                       ::equal_range(&(pQVar2->m)._M_t,&local_48);
            }
            if (pVar15.first._M_node._M_node != pVar15.second._M_node._M_node) {
              do {
                _Var9 = pVar15.first._M_node;
                p_Var3 = _Var9._M_node[1]._M_parent;
                local_78 = this_01;
                for (p_Var14 = p_Var3->_M_right; local_50 = pVar15.second._M_node,
                    p_Var14 != (_Base_ptr)&p_Var3->_M_right; p_Var14 = *(_Base_ptr *)p_Var14) {
                  puVar13 = *(undefined8 **)p_Var14;
                  local_40._M_node = (_List_node_base *)p_Var14->_M_left;
                  pGVar1 = this->_M_grammar;
                  __k = &p_Var14->_M_left;
                  cVar5 = std::
                          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                          ::find(&(pGVar1->non_terminals)._M_t,&local_40);
                  if (((_Rb_tree_header *)cVar5._M_node ==
                       &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) ||
                     (NVar12._M_node = extraout_RDX,
                     (_Base_ptr *)puVar13 != &(_Var9._M_node[1]._M_parent)->_M_right)) {
                    local_40._M_node = (_List_node_base *)0x0;
                    p_Var4 = local_78[1].data.nt._M_node;
                    pp_Var11 = (_Base_ptr *)&local_40;
                    if (p_Var4 != (_List_node_base *)0x0) {
                      cVar6 = std::
                              _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
                              ::find((_Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
                                      *)&p_Var4->_M_prev,(key_type *)__k);
                      pp_Var11 = &cVar6._M_node[1]._M_parent;
                      if (cVar6._M_node == (_Base_ptr)(local_78[1].data.nt._M_node + 1)) {
                        pp_Var11 = (_Base_ptr *)&local_40;
                      }
                    }
                    local_78 = (Node<Include> *)*pp_Var11;
                    pGVar1 = this->_M_grammar;
                    local_40._M_node = (_List_node_base *)*__k;
                    cVar5 = std::
                            _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                            ::find(&(pGVar1->non_terminals)._M_t,&local_40);
                    if ((_Rb_tree_header *)cVar5._M_node !=
                        &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
                      p_Var3 = _Var9._M_node[1]._M_parent;
                      NVar12._M_node = extraout_RDX_00;
                      for (; (_Base_ptr *)puVar13 != &p_Var3->_M_right;
                          puVar13 = (undefined8 *)*puVar13) {
                        local_40._M_node = (_List_node_base *)puVar13[2];
                        iVar7 = std::
                                _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                                ::find(&(this->nullables)._M_t,&local_40);
                        NVar12._M_node = extraout_RDX_01;
                        if ((_Rb_tree_header *)iVar7._M_node ==
                            &(this->nullables)._M_t._M_impl.super__Rb_tree_header) break;
                      }
                      if ((_Base_ptr *)puVar13 == &(_Var9._M_node[1]._M_parent)->_M_right)
                      goto LAB_0010cd97;
                    }
                  }
                  else {
LAB_0010cd97:
                    data.nt._M_node = NVar12._M_node;
                    data.state._M_node = local_48._M_node;
                    other = Node<Include>::get(this_01,data);
                    data_00.nt._M_node = extraout_RDX_02._M_node;
                    data_00.state._M_node = (_List_node_base *)*__k;
                    iVar8 = Node<Include>::get(local_78,data_00);
                    Node<Include>::insertEdge((Node<Include> *)(iVar8._M_node + 1),other);
                  }
                  p_Var3 = _Var9._M_node[1]._M_parent;
                }
                _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
                pVar15.second._M_node = local_50._M_node;
                pVar15.first._M_node = _Var9._M_node;
              } while (_Var9._M_node != local_50._M_node);
            }
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
        } while (p_Var10 != (_Rb_tree_node_base *)(this_00->_M_node + 1));
      }
      this_01 = *(Node<Include> **)this_01;
    } while (this_01 != (Node<Include> *)&this->states);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildIncludesDigraph ()
{
  for (StatePointer pp = states.begin (); pp != states.end (); ++pp)
    {
      for (Bundle::iterator a = pp->bundle.begin (); a != pp->bundle.end (); ++a)
        {
          Name name = a.key ();

          if (! _M_grammar->isNonTerminal (name))
            continue;

          const auto range = std::as_const(_M_grammar->rule_map).equal_range(name);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              StatePointer p = pp;

              for (NameList::iterator A = rule->rhs.begin (); A != rule->rhs.end (); ++A)
                {
                  NameList::iterator dot = A;
                  ++dot;

                  if (_M_grammar->isNonTerminal (*A) && dot == rule->rhs.end ())
                    {
                      // found an include edge.
                      IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                      IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                      source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                      qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES

                      continue;
                    }

                  p = p->bundle.value (*A);

                  if (! _M_grammar->isNonTerminal (*A))
                    continue;

                  NameList::iterator first_not_nullable = std::find_if(dot, rule->rhs.end(), NotNullable(this));
                  if (first_not_nullable != rule->rhs.end ())
                    continue;

                  // found an include edge.
                  IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                  IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                  source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                  qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES
                }
            }
        }
    }
}